

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O1

void __thiscall
icu_63::CharacterNode::deleteValues(CharacterNode *this,UObjectDeleter *valueDeleter)

{
  long *plVar1;
  
  plVar1 = (long *)this->fValues;
  if (plVar1 != (long *)0x0) {
    if (this->fHasValuesVector != '\0') {
      (**(code **)(*plVar1 + 8))();
      return;
    }
    if (valueDeleter != (UObjectDeleter *)0x0) {
      (*valueDeleter)(plVar1);
      return;
    }
  }
  return;
}

Assistant:

void CharacterNode::deleteValues(UObjectDeleter *valueDeleter) {
    if (fValues == NULL) {
        // Do nothing.
    } else if (!fHasValuesVector) {
        if (valueDeleter) {
            valueDeleter(fValues);
        }
    } else {
        delete (UVector *)fValues;
    }
}